

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::AdvancedUsageUBO::Run(AdvancedUsageUBO *this)

{
  bool bVar1;
  GLuint GVar2;
  GLuint uniformBlockIndex;
  reference pvVar3;
  size_type sVar4;
  CallLogWrapper *this_00;
  GLuint local_478 [2];
  GLuint data [256];
  undefined8 uStack_70;
  int s;
  undefined8 local_68;
  uint local_60;
  GLuint i;
  allocator<tcu::Vector<unsigned_int,_4>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> init_data;
  uint z;
  char *src_fs;
  char *src_vs;
  AdvancedUsageUBO *this_local;
  
  GVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                    (&this->super_SACSubcaseBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out uvec4 o_color;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter;\nlayout(std140) uniform Data {\n  uint index[256];\n} ub_data;\nvoid main() {\n  o_color = uvec4(ub_data.index[atomicCounterIncrement(ac_counter)]);\n}"
                     ,true);
  this->prog_ = GVar2;
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar2 = this->prog_;
  uniformBlockIndex = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,GVar2,"Data");
  glu::CallLogWrapper::glUniformBlockBinding(this_00,GVar2,uniformBlockIndex,1);
  init_data.
  super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->counter_buffer_);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
  glu::CallLogWrapper::glBufferData
            (this_00,0x92c0,4,
             (void *)((long)&init_data.
                             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  std::allocator<tcu::Vector<unsigned_int,_4>_>::allocator(&local_49);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            ((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )local_48,0x100,&local_49);
  std::allocator<tcu::Vector<unsigned_int,_4>_>::~allocator(&local_49);
  for (local_60 = 0; local_60 < 0x100; local_60 = local_60 + 1) {
    tcu::Vector<unsigned_int,_4>::Vector
              ((Vector<unsigned_int,_4> *)&stack0xffffffffffffff90,local_60);
    pvVar3 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)local_48,(ulong)local_60);
    *(undefined8 *)pvVar3->m_data = uStack_70;
    *(undefined8 *)(pvVar3->m_data + 2) = local_68;
  }
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->uniform_buffer_);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8a11,this->uniform_buffer_);
  sVar4 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
          ::size((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                  *)local_48);
  pvVar3 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)local_48,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8a11,sVar4 << 4,pvVar3,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8a11,0);
  data[0xff] = 0x10;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->rt_);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0xde1,this->rt_);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0xde1,0,0x8236,0x10,0x10,0,0x8d94,0x1405,(void *)0x0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0xde1,0);
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->fbo_);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,this->fbo_);
  glu::CallLogWrapper::glFramebufferTexture
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,0x8ce0,this->rt_,0);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,0);
  gl4cts::anon_unknown_0::SACSubcaseBase::CreateQuad
            (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,(GLuint *)0x0);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,this->fbo_);
  glu::CallLogWrapper::glViewport
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,
             0,0x10,0x10);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0,this->counter_buffer_);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8a11,1,this->uniform_buffer_);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->vao_);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,5,
             0,4);
  glu::CallLogWrapper::glReadBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8ce0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,
             0,0x10,0x10,0x8d94,0x1405,local_478);
  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                    (&this->super_SACSubcaseBase,0x100,local_478,0);
  if (bVar1) {
    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      (&this->super_SACSubcaseBase,this->counter_buffer_,0,0x100);
    if (bVar1) {
      this_local = (AdvancedUsageUBO *)0x0;
    }
    else {
      this_local = (AdvancedUsageUBO *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedUsageUBO *)&DAT_ffffffffffffffff;
  }
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::~vector
            ((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )local_48);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							 "  gl_Position = i_vertex;" NL "}";
		const char* src_fs =
			"#version 420 core" NL "layout(location = 0) out uvec4 o_color;" NL
			"layout(binding = 0, offset = 0) uniform atomic_uint ac_counter;" NL "layout(std140) uniform Data {" NL
			"  uint index[256];" NL "} ub_data;" NL "void main() {" NL
			"  o_color = uvec4(ub_data.index[atomicCounterIncrement(ac_counter)]);" NL "}";
		prog_ = CreateProgram(src_vs, NULL, NULL, NULL, src_fs, true);
		glUniformBlockBinding(prog_, glGetUniformBlockIndex(prog_, "Data"), 1);

		// create atomic counter buffer
		const unsigned int z = 0;
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(z), &z, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create uniform buffer
		std::vector<UVec4> init_data(256);
		for (GLuint i	= 0; i < 256; ++i)
			init_data[i] = UVec4(i);
		glGenBuffers(1, &uniform_buffer_);
		glBindBuffer(GL_UNIFORM_BUFFER, uniform_buffer_);
		glBufferData(GL_UNIFORM_BUFFER, (GLsizeiptr)(sizeof(UVec4) * init_data.size()), &init_data[0], GL_DYNAMIC_COPY);
		glBindBuffer(GL_UNIFORM_BUFFER, 0);

		// create render targets
		const int s = 16;
		glGenTextures(1, &rt_);
		glBindTexture(GL_TEXTURE_2D, rt_);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
		glBindTexture(GL_TEXTURE_2D, 0);

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, rt_, 0);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateQuad(&vao_, &vbo_, NULL);

		// draw
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBindBufferBase(GL_UNIFORM_BUFFER, 1, uniform_buffer_);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		// validate
		GLuint data[s * s];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 0))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 0, 256))
			return ERROR;

		return NO_ERROR;
	}